

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int isViableStructureTerrain(int structType,Generator *g,int x,int z)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  int in_EDI;
  double z_00;
  double x_00;
  int64_t *np;
  BiomeNoise *bn;
  double dVar2;
  double depth;
  int ret;
  int i;
  int nptype;
  double corners [4] [2];
  int rot;
  uint64_t rng;
  int cz;
  int cx;
  int sz;
  int sx;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int iVar3;
  int in_stack_ffffffffffffff84;
  uint64_t *in_stack_ffffffffffffff88;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_4;
  
  if (*in_RSI < 0x16) {
    local_4 = 1;
  }
  else {
    if ((in_EDI == 1) || (in_EDI == 2)) {
      local_1c = 0xc;
      if (in_EDI == 1) {
        local_1c = 0x15;
      }
      local_20 = 0xf;
      local_18 = in_ECX;
      local_14 = in_EDX;
      if (in_EDI == 1) {
        local_20 = 0x15;
      }
    }
    else {
      if (in_EDI != 9) {
        return 1;
      }
      chunkGenerateRnd(CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      iVar1 = nextInt(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
      local_1c = 5;
      local_20 = 5;
      if (iVar1 == 0) {
        local_1c = -5;
      }
      if (iVar1 == 1) {
        local_1c = -5;
        local_20 = -5;
      }
      if (iVar1 == 2) {
        local_20 = -5;
      }
      local_14 = (in_EDX >> 4) * 0x10 + 7;
      local_18 = (in_ECX >> 4) * 0x10 + 7;
    }
    z_00 = (double)(local_18 + local_20) / 4.0;
    x_00 = (double)local_14 / 4.0;
    np = (int64_t *)((double)(local_18 + local_20) / 4.0);
    bn = (BiomeNoise *)((double)(local_14 + local_1c) / 4.0);
    iVar1 = in_RSI[0x180a];
    local_4 = 1;
    in_RSI[0x180a] = 4;
    for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
      dVar2 = sampleClimatePara(bn,np,x_00,z_00);
      if (dVar2 < 0.48) {
        local_4 = 0;
        break;
      }
    }
    in_RSI[0x180a] = iVar1;
  }
  return local_4;
}

Assistant:

int isViableStructureTerrain(int structType, Generator *g, int x, int z)
{
    int sx, sz;
    if (g->mc <= MC_1_17)
        return 1;
    if (structType == Desert_Pyramid || structType == Jungle_Temple)
    {
        sx = (structType == Desert_Pyramid ? 21 : 12);
        sz = (structType == Desert_Pyramid ? 21 : 15);
    }
    else if (structType == Mansion)
    {
        int cx = x >> 4, cz = z >> 4;
        uint64_t rng = chunkGenerateRnd(g->seed, cx, cz);
        int rot = nextInt(&rng, 4);
        sx = 5;
        sz = 5;
        if (rot == 0) { sx = -5; }
        if (rot == 1) { sx = -5; sz = -5; }
        if (rot == 2) { sz = -5; }
        x = cx * 16 + 7;
        z = cz * 16 + 7;
    }
    else
    {
        return 1;
    }

    // approx surface height using depth parameter (0.5 ~ sea level)
    double corners[][2] = {
        {(x+ 0)/4.0, (z+ 0)/4.0},
        {(x+sx)/4.0, (z+sz)/4.0},
        {(x+ 0)/4.0, (z+sz)/4.0},
        {(x+sx)/4.0, (z+ 0)/4.0},
    };
    int nptype = g->bn.nptype;
    int i, ret = 1;
    g->bn.nptype = NP_DEPTH;
    for (i = 0; i < 4; i++)
    {
        double depth = sampleClimatePara(&g->bn, 0, corners[i][0], corners[i][1]);
        if (depth < 0.48)
        {
            ret = 0;
            break;
        }
    }
    g->bn.nptype = nptype;
    return ret;
}